

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_sse4.c
# Opt level: O0

void av1_convolve_2d_scale_sse4_1
               (uint8_t *src,int src_stride,uint8_t *dst8,int dst8_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params)

{
  int fo_vert;
  int ytaps;
  int xtaps;
  int im_h;
  int16_t tmp [34304];
  int in_stack_fffffffffffef534;
  int in_stack_fffffffffffef538;
  int in_stack_fffffffffffef53c;
  int16_t *in_stack_fffffffffffef540;
  int in_stack_fffffffffffef54c;
  uint8_t *in_stack_fffffffffffef550;
  int in_stack_fffffffffffef624;
  int in_stack_fffffffffffef628;
  int in_stack_fffffffffffef62c;
  uint8_t *in_stack_fffffffffffef630;
  int in_stack_fffffffffffef63c;
  int16_t *in_stack_fffffffffffef640;
  int in_stack_fffffffffffef830;
  InterpFilterParams *in_stack_fffffffffffef838;
  int in_stack_fffffffffffef840;
  int in_stack_fffffffffffefab0;
  int in_stack_fffffffffffefab8;
  InterpFilterParams *in_stack_fffffffffffefac0;
  ConvolveParams *in_stack_fffffffffffefac8;
  int in_stack_fffffffffffefad0;
  
  hfilter8(in_stack_fffffffffffef550,in_stack_fffffffffffef54c,in_stack_fffffffffffef540,
           in_stack_fffffffffffef53c,in_stack_fffffffffffef538,in_stack_fffffffffffef534,
           in_stack_fffffffffffef830,in_stack_fffffffffffef838,in_stack_fffffffffffef840);
  vfilter8(in_stack_fffffffffffef640,in_stack_fffffffffffef63c,in_stack_fffffffffffef630,
           in_stack_fffffffffffef62c,in_stack_fffffffffffef628,in_stack_fffffffffffef624,
           in_stack_fffffffffffefab0,in_stack_fffffffffffefab8,in_stack_fffffffffffefac0,
           in_stack_fffffffffffefac8,in_stack_fffffffffffefad0);
  return;
}

Assistant:

void av1_convolve_2d_scale_sse4_1(const uint8_t *src, int src_stride,
                                  uint8_t *dst8, int dst8_stride, int w, int h,
                                  const InterpFilterParams *filter_params_x,
                                  const InterpFilterParams *filter_params_y,
                                  const int subpel_x_qn, const int x_step_qn,
                                  const int subpel_y_qn, const int y_step_qn,
                                  ConvolveParams *conv_params) {
  int16_t tmp[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;

  const int xtaps = filter_params_x->taps;
  const int ytaps = filter_params_y->taps;
  const int fo_vert = ytaps / 2 - 1;
  assert((xtaps == 8) && (ytaps == 8));
  (void)xtaps;

  // horizontal filter
  hfilter8(src - fo_vert * src_stride, src_stride, tmp, w, im_h, subpel_x_qn,
           x_step_qn, filter_params_x, conv_params->round_0);

  // vertical filter (input is transposed)
  vfilter8(tmp, im_h, dst8, dst8_stride, w, h, subpel_y_qn, y_step_qn,
           filter_params_y, conv_params, 8);
}